

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O3

vector<absl::string_view,_std::allocator<absl::string_view>_> * __thiscall
s2textformat::SplitString
          (vector<absl::string_view,_std::allocator<absl::string_view>_> *__return_storage_ptr__,
          s2textformat *this,string_view str,char separator)

{
  pointer psVar1;
  size_type extraout_RDX;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *__range1;
  string_view *e;
  pointer psVar2;
  string_view str_00;
  string_view sVar3;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  string_view local_28;
  
  local_28.length_ = (size_type)str.ptr_;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::_Function_handler<bool_(absl::string_view),_absl::SkipWhitespace>::_M_invoke;
  local_38 = std::_Function_handler<bool_(absl::string_view),_absl::SkipWhitespace>::_M_manager;
  local_28.ptr_ = (char *)this;
  absl::StrSplit<absl::string_view>
            (__return_storage_ptr__,&local_28,(char)str.length_,
             (function<bool_(absl::string_view)> *)&local_48);
  sVar3.length_ = extraout_RDX;
  sVar3.ptr_ = (char *)local_38;
  if (local_38 != (code *)0x0) {
    sVar3 = (string_view)(*local_38)(&local_48,&local_48,__destroy_functor);
  }
  psVar2 = (__return_storage_ptr__->
           super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>)._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (__return_storage_ptr__->
           super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    str_00.length_ = sVar3.length_;
    if (psVar2 == psVar1) break;
    str_00.ptr_ = (char *)psVar2->length_;
    sVar3 = absl::StripAsciiWhitespace((absl *)psVar2->ptr_,str_00);
    *psVar2 = sVar3;
    psVar2 = psVar2 + 1;
  }
  return (vector<absl::string_view,_std::allocator<absl::string_view>_> *)sVar3.ptr_;
}

Assistant:

static vector<string_view> SplitString(string_view str, char separator) {
  vector<string_view> result =
      absl::StrSplit(str, separator, absl::SkipWhitespace());
  for (auto& e : result) {
    e = absl::StripAsciiWhitespace(e);
  }
  return result;
}